

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O0

int process_lmnamectl_line(ps_decoder_t *ps,cmd_ln_t *config,char *lmname)

{
  int iVar1;
  undefined8 in_R9;
  char *lmname_local;
  cmd_ln_t *config_local;
  ps_decoder_t *ps_local;
  
  if (lmname == (char *)0x0) {
    ps_local._4_4_ = 0;
  }
  else {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
            ,0x14f,"Using language model: %s\n",lmname,in_R9,lmname,config);
    iVar1 = ps_activate_search(ps,lmname);
    if (iVar1 == 0) {
      ps_local._4_4_ = 0;
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
              ,0x151,"No such language model: %s\n",lmname,in_R9,lmname,config);
      ps_local._4_4_ = -1;
    }
  }
  return ps_local._4_4_;
}

Assistant:

static int
process_lmnamectl_line(ps_decoder_t *ps, cmd_ln_t *config, char const *lmname)
{
    (void)config;
    if (!lmname)
        return 0;

    E_INFO("Using language model: %s\n", lmname);
    if (ps_activate_search(ps, lmname)) {
        E_ERROR("No such language model: %s\n", lmname);
        return -1;
    }
    return 0;
}